

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,uint singleStream,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  BYTE *op_00;
  size_t sVar5;
  BYTE *in_RCX;
  U32 *in_RDX;
  HUF_CElt *in_RSI;
  undefined1 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  size_t newSize;
  size_t oldSize;
  size_t hSize;
  size_t maxBits;
  int in_stack_00000030;
  uint estimate_bytes;
  U32 t_bits_input;
  uint t_bits;
  uint c_bits;
  U32 c_i;
  uint i;
  uint nonzero_count;
  U64 sum_clogc;
  U64 total;
  size_t largest;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  HUF_compress_tables_t *table;
  uint *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  uint *in_stack_ffffffffffffff60;
  uint *in_stack_ffffffffffffff68;
  BYTE *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  U32 local_80;
  int local_7c;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  long lVar7;
  ulong local_60;
  BYTE *local_8;
  
  if ((newSize & 3) == 0) {
    if (oldSize < 0x1800) {
      local_8 = (BYTE *)0xffffffffffffffbe;
    }
    else if (in_RCX == (BYTE *)0x0) {
      local_8 = (BYTE *)0x0;
    }
    else if (in_RSI == (HUF_CElt *)0x0) {
      local_8 = (BYTE *)0x0;
    }
    else if (in_RCX < (BYTE *)0x20001) {
      if (in_R9D < 0xd) {
        if (in_R8D < 0x100) {
          if (in_R8D == 0) {
            in_R8D = 0xff;
          }
          if (((in_stack_00000030 == 0) || (maxBits == 0)) || (*(int *)maxBits != 2)) {
            local_8 = (BYTE *)FSE_count_wksp(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                             in_stack_ffffffffffffff58,
                                             CONCAT44(in_stack_ffffffffffffff54,
                                                      in_stack_ffffffffffffff50),
                                             in_stack_ffffffffffffff48);
            uVar1 = ERR_isError((size_t)local_8);
            if (uVar1 == 0) {
              if (local_8 == in_RCX) {
                *in_RDI = (char)*in_RDX;
                local_8 = (BYTE *)0x1;
              }
              else if ((BYTE *)(((ulong)in_RCX >> 7) + 1) < local_8) {
                local_60 = 0;
                lVar7 = 0;
                uVar1 = 0;
                for (uVar6 = 0; uVar6 < in_R8D; uVar6 = uVar6 + 1) {
                  uVar3 = *(uint *)(newSize + (ulong)uVar6 * 4);
                  if (uVar3 != 0) {
                    local_60 = uVar3 + local_60;
                    uVar1 = uVar1 + 1;
                    uVar2 = BIT_highbit32(uVar3);
                    lVar7 = (ulong)(uVar3 * (uVar2 + 1)) + lVar7;
                  }
                }
                local_7c = 0;
                local_80 = (U32)local_60;
                if (0xffffffff < local_60) {
                  local_7c = 0x20;
                  local_80 = (U32)(local_60 >> 0x20);
                }
                uVar3 = BIT_highbit32(local_80);
                if (uVar1 < 0x41) {
                  uVar2 = uVar1 >> 1;
                }
                else {
                  uVar2 = uVar1 >> 2;
                }
                uVar2 = uVar2 + (int)(local_60 * (uVar3 + 1 + local_7c) - lVar7 >> 3);
                if (in_RCX < (BYTE *)(ulong)uVar2) {
                  local_8 = (BYTE *)0x0;
                }
                else {
                  if (((maxBits != 0) && (*(int *)maxBits == 1)) &&
                     (iVar4 = HUF_validateCTable((HUF_CElt *)hSize,(uint *)newSize,in_R8D),
                     iVar4 == 0)) {
                    *(undefined4 *)maxBits = 0;
                  }
                  iVar4 = (int)lVar7;
                  if (((in_stack_00000030 == 0) || (maxBits == 0)) || (*(int *)maxBits == 0)) {
                    uVar3 = HUF_optimalTableLog(in_stack_ffffffffffffff54,
                                                (size_t)in_stack_ffffffffffffff48,0);
                    op_00 = (BYTE *)HUF_buildCTable_wksp
                                              (in_RSI,in_RDX,(U32)((ulong)in_RCX >> 0x20),
                                               (U32)in_RCX,(void *)CONCAT44(in_R8D,uVar3),newSize);
                    uVar3 = ERR_isError((size_t)op_00);
                    local_8 = op_00;
                    if (uVar3 == 0) {
                      memset((uint *)(newSize + ((ulong)(in_R8D + 1) + 0x100) * 4),0,
                             (ulong)(in_R8D + 1) * -4 + 0x400);
                      local_8 = (BYTE *)HUF_writeCTable((void *)CONCAT44(maxSymbolValue,huffLog),
                                                        (size_t)table,(HUF_CElt *)ostart,oend._4_4_,
                                                        (U32)oend);
                      uVar3 = ERR_isError((size_t)local_8);
                      if (uVar3 == 0) {
                        if ((maxBits != 0) && (*(int *)maxBits != 0)) {
                          in_stack_ffffffffffffff60 =
                               (uint *)HUF_estimateCompressedSize
                                                 ((HUF_CElt *)hSize,(uint *)newSize,in_R8D);
                          in_stack_ffffffffffffff58 =
                               (void *)HUF_estimateCompressedSize
                                                 ((HUF_CElt *)(newSize + 0x400),(uint *)newSize,
                                                  in_R8D);
                          if ((in_stack_ffffffffffffff60 <=
                               local_8 + (long)in_stack_ffffffffffffff58) ||
                             (in_RCX <= local_8 + 0xc)) {
                            sVar5 = HUF_compressCTable_internal
                                              ((BYTE *)CONCAT44(uVar2,in_stack_ffffffffffffff78),
                                               op_00,local_8,in_stack_ffffffffffffff60,
                                               (size_t)in_stack_ffffffffffffff58,
                                               in_stack_ffffffffffffff54,
                                               (HUF_CElt *)CONCAT44(uVar1,uVar6),iVar4);
                            return sVar5;
                          }
                        }
                        if (local_8 + 0xc < in_RCX) {
                          if (maxBits != 0) {
                            *(undefined4 *)maxBits = 0;
                          }
                          if (hSize != 0) {
                            memcpy((void *)hSize,(uint *)(newSize + 0x400),0x400);
                          }
                          local_8 = (BYTE *)HUF_compressCTable_internal
                                                      ((BYTE *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff78),op_00,local_8,
                                                  in_stack_ffffffffffffff60,
                                                  (size_t)in_stack_ffffffffffffff58,
                                                  in_stack_ffffffffffffff54,
                                                  (HUF_CElt *)CONCAT44(uVar1,uVar6),iVar4);
                        }
                        else {
                          local_8 = (BYTE *)0x0;
                        }
                      }
                    }
                  }
                  else {
                    local_8 = (BYTE *)HUF_compressCTable_internal
                                                ((BYTE *)CONCAT44(uVar2,in_stack_ffffffffffffff78),
                                                 in_stack_ffffffffffffff70,
                                                 (BYTE *)in_stack_ffffffffffffff68,
                                                 in_stack_ffffffffffffff60,
                                                 (size_t)in_stack_ffffffffffffff58,
                                                 in_stack_ffffffffffffff54,
                                                 (HUF_CElt *)CONCAT44(uVar1,uVar6),iVar4);
                  }
                }
              }
              else {
                local_8 = (BYTE *)0x0;
              }
            }
          }
          else {
            local_8 = (BYTE *)HUF_compressCTable_internal
                                        ((BYTE *)CONCAT44(in_stack_ffffffffffffff7c,
                                                          in_stack_ffffffffffffff78),
                                         in_stack_ffffffffffffff70,(BYTE *)in_stack_ffffffffffffff68
                                         ,in_stack_ffffffffffffff60,
                                         (size_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54
                                         ,(HUF_CElt *)
                                          CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),
                                         in_stack_ffffffffffffff98);
          }
        }
        else {
          local_8 = (BYTE *)0xffffffffffffffd2;
        }
      }
      else {
        local_8 = (BYTE *)0xffffffffffffffd4;
      }
    }
    else {
      local_8 = (BYTE *)0xffffffffffffffb8;
    }
  }
  else {
    local_8 = (BYTE *)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

static size_t HUF_compress_internal (
                void* dst, size_t dstSize,
                const void* src, size_t srcSize,
                unsigned maxSymbolValue, unsigned huffLog,
                unsigned singleStream,
                void* workSpace, size_t wkspSize,
                HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           singleStream, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {  CHECK_V_F(largest, FSE_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->count) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7) + 1) {
            return 0;   /* heuristic : probably not compressible enough */
        }

        /* Added this more accurate heuristic to handle high entropy data properly -catid */
        U64 total = 0;
        U64 sum_clogc = 0;
        unsigned nonzero_count = 0;
        for (unsigned i = 0; i < maxSymbolValue; ++i) {
            U32 const c_i = table->count[i];
            if (c_i == 0) {
                continue;
            }
            total += c_i;
            ++nonzero_count;
            unsigned const c_bits = BIT_highbit32(c_i) + 1;
            sum_clogc += c_i * c_bits;
        }
        unsigned t_bits = 0;
        U32 t_bits_input = (U32)total;
        if (total >= 0x100000000ULL) {
            t_bits = 32;
            t_bits_input = (U32)(total >> 32);
        }
        t_bits += BIT_highbit32(t_bits_input) + 1;
        unsigned estimate_bytes = (unsigned)((total * t_bits - sum_clogc) / 8);
        if (nonzero_count > 64) {
            estimate_bytes += nonzero_count / 4;
        }
        else {
            estimate_bytes += nonzero_count / 2;
        }
        if (estimate_bytes > srcSize) {
            return 0;   /* heuristic : probably not compressible enough */
        }
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           singleStream, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   CHECK_V_F(maxBits, HUF_buildCTable_wksp(table->CTable, table->count,
                                                maxSymbolValue, huffLog,
                                                table->nodeTable, sizeof(table->nodeTable)) );
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   singleStream, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       singleStream, table->CTable, bmi2);
}